

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

object_type * __thiscall
entt::basic_storage<entt::entity,Transform,void>::construct<Transform_const&>
          (basic_storage<entt::entity,Transform,void> *this,entity_type entt,Transform *args)

{
  reference pvVar1;
  Transform *args_local;
  entity_type entt_local;
  basic_storage<entt::entity,_Transform,_void> *this_local;
  
  std::vector<Transform,std::allocator<Transform>>::emplace_back<Transform_const&>
            ((vector<Transform,std::allocator<Transform>> *)(this + 0x38),args);
  sparse_set<entt::entity>::construct((sparse_set<entt::entity> *)this,entt);
  pvVar1 = std::vector<Transform,_std::allocator<Transform>_>::back
                     ((vector<Transform,_std::allocator<Transform>_> *)(this + 0x38));
  return pvVar1;
}

Assistant:

object_type & construct(const entity_type entt, Args &&... args) {
        if constexpr(std::is_aggregate_v<object_type>) {
            instances.emplace_back(Type{std::forward<Args>(args)...});
        } else {
            instances.emplace_back(std::forward<Args>(args)...);
        }

        // entity goes after component in case constructor throws
        underlying_type::construct(entt);
        return instances.back();
    }